

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

int luaL_ref(lua_State *L,int t)

{
  int iVar1;
  lua_Integer lVar2;
  size_t sVar3;
  int n;
  
  if (0xffffd8ef < t - 1U) {
    iVar1 = lua_gettop(L);
    t = t + iVar1 + 1;
  }
  n = -1;
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
  }
  else {
    lua_rawgeti(L,t,0);
    lVar2 = lua_tointeger(L,-1);
    lua_settop(L,-2);
    n = (int)lVar2;
    if (n == 0) {
      sVar3 = lua_objlen(L,t);
      n = (int)sVar3 + 1;
    }
    else {
      lua_rawgeti(L,t,n);
      lua_rawseti(L,t,0);
    }
    lua_rawseti(L,t,n);
  }
  return n;
}

Assistant:

LUALIB_API int luaL_ref(lua_State *L, int t)
{
  int ref;
  t = abs_index(L, t);
  if (lua_isnil(L, -1)) {
    lua_pop(L, 1);  /* remove from stack */
    return LUA_REFNIL;  /* `nil' has a unique fixed reference */
  }
  lua_rawgeti(L, t, FREELIST_REF);  /* get first free element */
  ref = (int)lua_tointeger(L, -1);  /* ref = t[FREELIST_REF] */
  lua_pop(L, 1);  /* remove it from stack */
  if (ref != 0) {  /* any free element? */
    lua_rawgeti(L, t, ref);  /* remove it from list */
    lua_rawseti(L, t, FREELIST_REF);  /* (t[FREELIST_REF] = t[ref]) */
  } else {  /* no free elements */
    ref = (int)lua_objlen(L, t);
    ref++;  /* create new reference */
  }
  lua_rawseti(L, t, ref);
  return ref;
}